

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O0

void Am_Choice_Start_Method_proc
               (Am_Object *inter,Am_Object *object,Am_Object *event_window,Am_Input_Event *ev)

{
  int iVar1;
  Am_Input_Char AVar2;
  bool bVar3;
  Am_Value *pAVar4;
  Am_Wrapper *value;
  Am_Inter_Location local_b8;
  Am_Object local_b0;
  Am_Input_Char local_a4;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Input_Char local_84;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68 [3];
  Am_Input_Char local_4c;
  int local_48;
  Am_Input_Char ic;
  int y;
  int x;
  Am_Object command_obj;
  Am_Inter_Internal_Method inter_method;
  Am_Input_Event *ev_local;
  Am_Object *event_window_local;
  Am_Object *object_local;
  Am_Object *inter_local;
  
  bVar3 = Am_Check_Inter_Abort_Inactive_Object(object,0x15b,inter);
  if (bVar3) {
    Am_Inter_Internal_Method::Am_Inter_Internal_Method((Am_Inter_Internal_Method *)&command_obj);
    pAVar4 = Am_Object::Get(&Am_Interactor,0xbe,0);
    Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&command_obj,pAVar4);
    (*(code *)inter_method.from_wrapper)(inter,object,event_window,ev);
    Am_Object::Am_Object((Am_Object *)&y);
    ic = (Am_Input_Char)ev->x;
    local_48 = ev->y;
    local_4c = ev->input_char;
    pAVar4 = Am_Object::Get(inter,0xc5,0);
    Am_Object::operator=((Am_Object *)&y,pAVar4);
    Am_Inter_Call_Both_Method
              (inter,(Am_Object *)&y,199,(int)ic,local_48,event_window,&local_4c,object,
               &Am_No_Location);
    pAVar4 = Am_Object::Get(inter,0xcb,0);
    bVar3 = Am_Value::operator_cast_to_bool(pAVar4);
    if (bVar3) {
      Am_Object::Am_Object(local_68,(Am_Object *)&y);
      Am_Object::Am_Object(&local_70,object);
      Am_Object::Am_Object(&local_78,inter);
      AVar2 = ic;
      iVar1 = local_48;
      Am_Object::Am_Object(&local_80,event_window);
      local_84 = local_4c;
      Choice_Handle_New_Old(local_68,&local_70,&local_78,(int)AVar2,iVar1,&local_80,local_4c);
      Am_Object::~Am_Object(&local_80);
      Am_Object::~Am_Object(&local_78);
      Am_Object::~Am_Object(&local_70);
      Am_Object::~Am_Object(local_68);
    }
    else {
      value = Am_Object::operator_cast_to_Am_Wrapper_(object);
      Am_Object::Set(inter,0x16a,value,0);
      Am_Object::Am_Object(&local_90,inter);
      Am_Object::Am_Object(&local_98,(Am_Object *)&y);
      AVar2 = ic;
      iVar1 = local_48;
      Am_Object::Am_Object(&local_a0,event_window);
      local_a4 = local_4c;
      Am_Object::Am_Object(&local_b0,object);
      Am_Inter_Location::Am_Inter_Location(&local_b8,&Am_No_Location);
      Am_Call_Final_Do_And_Register
                (&local_90,&local_98,(int)AVar2,iVar1,&local_a0,local_a4,&local_b0,&local_b8,
                 choice_set_impl_command);
      Am_Inter_Location::~Am_Inter_Location(&local_b8);
      Am_Object::~Am_Object(&local_b0);
      Am_Object::~Am_Object(&local_a0);
      Am_Object::~Am_Object(&local_98);
      Am_Object::~Am_Object(&local_90);
    }
    Am_Object::~Am_Object((Am_Object *)&y);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Choice_Start_Method,
                 (Am_Object & inter, Am_Object &object, Am_Object &event_window,
                  Am_Input_Event *ev))
{
  Am_INTER_TRACE_PRINT(inter, "Choice starting over " << object);

  //do this before prototype's method, so won't even change state
  if (!Am_Check_Inter_Abort_Inactive_Object(object, Am_SELECT_INACTIVE, inter))
    return;

  // first, call the prototype's method
  Am_Inter_Internal_Method inter_method;
  inter_method = Am_Interactor.Get(Am_INTER_START_METHOD);
  inter_method.Call(inter, object, event_window, ev);

  Am_Object command_obj;
  int x = ev->x;
  int y = ev->y;
  Am_Input_Char ic = ev->input_char;
  command_obj = inter.Get(Am_COMMAND);

  Am_Inter_Call_Both_Method(inter, command_obj, Am_START_DO_METHOD, x, y,
                            event_window, ic, object, Am_No_Location);

  if ((bool)inter.Get(Am_CONTINUOUS))
    //calls interim_do_method
    Choice_Handle_New_Old(command_obj, object, inter, x, y, event_window, ic);
  else { // not continuous, just call stop
    inter.Set(Am_INTERIM_VALUE, object);
    Am_Call_Final_Do_And_Register(inter, command_obj, x, y, event_window, ic,
                                  object, Am_No_Location,
                                  choice_set_impl_command);
  }
}